

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int big2_nameLength(ENCODING *enc,char *ptr)

{
  uint local_24;
  char *start;
  char *ptr_local;
  ENCODING *enc_local;
  
  start = ptr;
  do {
    if (*start == '\0') {
      local_24 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)start[1]);
    }
    else {
      local_24 = unicode_byte_type(*start,start[1]);
    }
    switch(local_24) {
    case 5:
      start = start + 2;
      break;
    case 6:
      start = start + 3;
      break;
    case 7:
      start = start + 4;
      break;
    default:
      return (int)start - (int)ptr;
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1d:
      start = start + 2;
    }
  } while( true );
}

Assistant:

PREFIX(nameLength)(const ENCODING *enc, const char *ptr) {
  const char *start = ptr;
  for (;;) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    ptr += n; /* NOTE: The encoding has already been validated. */             \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_NONASCII:
    case BT_NMSTRT:
#  ifdef XML_NS
    case BT_COLON:
#  endif
    case BT_HEX:
    case BT_DIGIT:
    case BT_NAME:
    case BT_MINUS:
      ptr += MINBPC(enc);
      break;
    default:
      return (int)(ptr - start);
    }
  }
}